

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c7dac::RemoveInteractionsFromBPM_basic_Test::TestBody
          (RemoveInteractionsFromBPM_basic_Test *this)

{
  void *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  bool bVar3;
  const_iterator __begin1;
  double *pdVar4;
  const_iterator __end1;
  int iVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *key;
  long lVar6;
  pointer key_00;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  _Var7;
  char *pcVar8;
  char *expected_predicate_value;
  pointer puVar9;
  double dVar10;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  initializer_list<unsigned_int> __l_16;
  initializer_list<unsigned_int> __l_17;
  initializer_list<unsigned_int> __l_18;
  initializer_list<unsigned_int> __l_19;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_20;
  initializer_list<unsigned_int> __l_21;
  initializer_list<unsigned_int> __l_22;
  initializer_list<unsigned_int> __l_23;
  initializer_list<unsigned_int> __l_24;
  initializer_list<unsigned_int> __l_25;
  initializer_list<unsigned_int> __l_26;
  PolynomialKeyList<uint32_t> removed_key_list;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  Polynomial<uint32_t,_double> polynomial;
  undefined1 local_5a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_598;
  pointer local_590;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_588;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_570;
  undefined1 local_558 [16];
  undefined1 local_548 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_528;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined1 local_4f5;
  char local_4f4;
  undefined1 local_4f3;
  allocator_type local_4f2;
  allocator_type local_4f1;
  allocator_type local_4f0;
  allocator_type local_4ef;
  allocator_type local_4ee;
  allocator_type local_4ed;
  allocator_type local_4ec;
  allocator_type local_4eb;
  allocator_type local_4ea;
  allocator_type local_4e9;
  allocator_type local_4e8;
  allocator_type local_4e7;
  allocator_type local_4e6;
  allocator_type local_4e5;
  allocator_type local_4e4;
  allocator_type local_4e3;
  allocator_type local_4e2;
  allocator_type local_4e1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_4e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_480;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_468;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_420;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a8;
  uint local_38c [5];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  uint local_358 [2];
  undefined1 *local_350;
  uint local_348 [2];
  undefined8 local_340;
  uint local_338 [2];
  long local_330;
  undefined1 *local_328;
  undefined1 local_320 [56];
  undefined1 local_2e8 [32];
  undefined1 *local_2c8;
  undefined1 local_2c0 [24];
  size_type local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  size_t local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_280;
  pointer local_268;
  undefined1 local_260 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_250;
  pointer local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined8 local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  undefined8 local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  undefined8 local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  undefined8 local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_180;
  undefined8 local_168;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  undefined8 local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  undefined8 local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  undefined8 local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  undefined8 local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  undefined8 local_c8;
  undefined1 local_c0 [4];
  uint local_bc [6];
  undefined1 *local_a4;
  undefined4 local_9c;
  undefined1 *local_98;
  undefined4 local_90;
  undefined1 *local_8c;
  undefined4 local_84;
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80;
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  local_38c[4] = 1;
  __l._M_len = 1;
  __l._M_array = local_38c + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l,&local_4e1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558);
  local_320._24_8_ = 0x3ff0000000000000;
  local_38c[3] = 2;
  __l_00._M_len = 1;
  __l_00._M_array = local_38c + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4e0,__l_00,&local_4e2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_320 + 0x20),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4e0);
  local_2e8._0_8_ = &DAT_4000000000000000;
  local_38c[2] = 3;
  __l_01._M_len = 1;
  __l_01._M_array = local_38c + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5a0,__l_01,&local_4e3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 8),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5a0);
  local_2c8 = &DAT_4008000000000000;
  local_38c[1] = 4;
  __l_02._M_len = 1;
  __l_02._M_array = local_38c + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_588,__l_02,&local_4e4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c0,&local_588);
  local_2a8 = 0x4010000000000000;
  local_328 = &DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_328;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_570,__l_03,&local_4e5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2a0,&local_570);
  local_288 = 0x4028000000000000;
  local_330 = 0x300000001;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_330;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4b0,__l_04,&local_4e6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_280,&local_4b0);
  local_268 = (pointer)0x402a000000000000;
  local_338[0] = 1;
  local_338[1] = 4;
  __l_05._M_len = 2;
  __l_05._M_array = local_338;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4c8,__l_05,&local_4e7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260,&local_4c8);
  local_248 = (pointer)0x402c000000000000;
  local_340 = 0x300000002;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_340;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_480,__l_06,&local_4e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_240,&local_480);
  local_228._0_8_ = (__buckets_ptr)0x4037000000000000;
  local_348[0] = 2;
  local_348[1] = 4;
  __l_07._M_len = 2;
  __l_07._M_array = local_348;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_498,__l_07,&local_4e9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_228 + 8),&local_498);
  local_208._0_8_ = 0x4038000000000000;
  local_350 = &DAT_400000003;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_350;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3a8,__l_08,&local_4ea);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_208 + 8),&local_3a8);
  local_1e8 = 0x4041000000000000;
  local_8c = &DAT_c0000000b;
  local_84 = 0xe;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_8c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3c0,__l_09,&local_4eb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1e0,&local_3c0);
  local_1c8 = 0xbff0000000000000;
  local_38c[0] = 7;
  __l_10._M_len = 1;
  __l_10._M_array = local_38c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3d8,__l_10,&local_4ec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c0,&local_3d8);
  local_1a8 = 0xc000000000000000;
  local_358[0] = 2;
  local_358[1] = 0xb;
  __l_11._M_len = 2;
  __l_11._M_array = local_358;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3f0,__l_11,&local_4ed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a0,&local_3f0);
  local_188 = 0xc022000000000000;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_180,&local_378);
  local_168 = 0xc008000000000000;
  local_98 = &DAT_200000001;
  local_90 = 3;
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_408,__l_12,&local_4ee);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_160,&local_408);
  local_148 = 0x405ec00000000000;
  local_a4 = &DAT_200000001;
  local_9c = 4;
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&local_a4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_420,__l_13,&local_4ef);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_140,&local_420);
  local_128 = 0x405f000000000000;
  local_bc[3] = 1;
  local_bc[4] = 3;
  local_bc[5] = 4;
  __l_14._M_len = 3;
  __l_14._M_array = local_bc + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_438,__l_14,&local_4f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_120,&local_438);
  local_108 = 0x4060c00000000000;
  local_bc[0] = 2;
  local_bc[1] = 3;
  local_bc[2] = 4;
  __l_15._M_len = 3;
  __l_15._M_array = local_bc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_450,__l_15,&local_4f1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_100,&local_450);
  local_e8 = 0x406d400000000000;
  local_48 = &DAT_200000001;
  puStack_40 = &DAT_400000003;
  __l_16._M_len = 4;
  __l_16._M_array = (iterator)&local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_468,__l_16,&local_4f2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e0,&local_468);
  local_c8 = 0x4093480000000000;
  expected_predicate_value = &local_4f4;
  std::
  _Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>const*>
            ((_Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_80,local_320,local_c0,0,&local_4f3,expected_predicate_value,&local_4f5);
  lVar6 = 0x260;
  do {
    pvVar1 = *(void **)((long)&local_340 + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_330 + lVar6) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != 0);
  if (local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_420.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_420.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_420.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_420.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_480.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_480.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_480.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_480.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_5a0,(long)local_590 - (long)local_5a0);
  }
  if (local_4e0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete(local_4e0.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            ((BinaryPolynomialModel<unsigned_int,_double> *)local_320,
             (Polynomial<unsigned_int,_double> *)&local_80,SPIN);
  local_5a0[0] = (internal)0xb;
  local_5a0._1_7_ = 0xe000000;
  local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_598._4_4_,0xc);
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)local_5a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_17,
             (allocator_type *)&local_4b0);
  local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_18._M_len = 1;
  __l_18._M_array = (iterator)&local_570;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_548 + 8),__l_18,
             (allocator_type *)&local_4c8);
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x20000000b;
  __l_19._M_len = 2;
  __l_19._M_array = (iterator)&local_588;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_528,__l_19,(allocator_type *)&local_480);
  local_510 = 0;
  uStack_508 = 0;
  local_500 = 0;
  __l_20._M_len = 4;
  __l_20._M_array = (iterator)local_558;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_4e0,__l_20,(allocator_type *)&local_498);
  lVar6 = 0x60;
  do {
    pvVar1 = *(void **)((long)&local_570.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_558 + lVar6 + -8) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  if (local_4e0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_00 = local_4e0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cimod::BinaryPolynomialModel<unsigned_int,_double>::RemoveInteraction
                ((BinaryPolynomialModel<unsigned_int,_double> *)local_320,key_00);
      key_00 = key_00 + 1;
    } while (key_00 != local_4e0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_558._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_558._8_8_ = (pointer)0x0;
  local_548._0_8_ = (pointer)0x0;
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_320,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5a0,"bpm.GetPolynomial({} )","0.0",dVar10,0.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c6,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_558._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_21._M_len = 1;
  __l_21._M_array = (iterator)&local_588;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_21,
             (allocator_type *)&local_570);
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_320,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5a0,"bpm.GetPolynomial({7} )","0.0",dVar10,0.0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c7,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xb00000002;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)&local_588;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_22,
             (allocator_type *)&local_570);
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_320,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5a0,"bpm.GetPolynomial({2, 11} )","0.0",dVar10,0.0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_558._0_8_ !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c8,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_c0000000b;
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xe;
  __l_23._M_len = 3;
  __l_23._M_array = (iterator)&local_588;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_23,
             (allocator_type *)&local_570);
  dVar10 = cimod::BinaryPolynomialModel<unsigned_int,_double>::GetPolynomial
                     ((BinaryPolynomialModel<unsigned_int,_double> *)local_320,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5a0,"bpm.GetPolynomial({11, 12, 14})","0.0",dVar10,0.0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3c9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  pvVar2 = local_250;
  local_558._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_558._8_8_ = (pointer)0x0;
  local_548._0_8_ = (pointer)0x0;
  puVar9 = (pointer)0x0;
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_558;
  if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260._8_8_ != local_250) {
    _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260._8_8_;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_588,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != pvVar2);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_5a0,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{} )"
             ,"0",(long *)&local_570,(int *)&local_588);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_558._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  pvVar2 = local_250;
  _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260._8_8_;
  local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,7);
  __l_24._M_len = 1;
  __l_24._M_array = (iterator)&local_4b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_24,
             (allocator_type *)&local_4c8);
  puVar9 = (pointer)0x0;
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_558;
  if (_Var7._M_current != pvVar2) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_588,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != pvVar2);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_5a0,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{7} )"
             ,"0",(long *)&local_570,(int *)&local_588);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  pvVar2 = local_250;
  _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260._8_8_;
  local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xb00000002;
  __l_25._M_len = 2;
  __l_25._M_array = (iterator)&local_4b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_25,
             (allocator_type *)&local_4c8);
  puVar9 = (pointer)0x0;
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_558;
  if (_Var7._M_current != pvVar2) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_588,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != pvVar2);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_5a0,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 11} )"
             ,"0",(long *)&local_570,(int *)&local_588);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3cd,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_558._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_c0000000b;
  local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xe;
  __l_26._M_len = 3;
  __l_26._M_array = (iterator)&local_588;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_26,
             (allocator_type *)&local_4c8);
  puVar9 = (pointer)0x0;
  local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_558;
  if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260._8_8_ != local_250) {
    _Var7._M_current = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260._8_8_;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
              operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                          *)&local_570,_Var7);
      puVar9 = (pointer)((long)puVar9 + (ulong)bVar3);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != local_250);
  }
  local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_570.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_5a0,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{11, 12, 14})"
             ,"0",(long *)&local_4b0,(int *)&local_570);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_558._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_558._0_8_,local_548._0_8_ - local_558._0_8_);
  }
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_558);
    if (local_598 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_598->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x3ce,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_558._0_8_ + 8))();
    }
  }
  if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,local_598);
  }
  if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    pdVar4 = (double *)
             local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 3.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    local_5a0[0] = (internal)(iVar5 == 0);
    local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_5a0[0]) {
      testing::Message::Message((Message *)&local_588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_558,(internal *)local_5a0,
                 (AssertionResult *)"EXPECT_CONTAIN(-3.0, bpm.GetValueList())","true","false",
                 expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_570,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x3d0,(char *)local_558._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_570,(Message *)&local_588);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548) {
        operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
      }
      if (local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_588.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_598,local_598);
      }
    }
  }
  if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    pdVar4 = (double *)
             local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 2.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    local_5a0[0] = (internal)(iVar5 == 0);
    local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_5a0[0]) {
      testing::Message::Message((Message *)&local_588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_558,(internal *)local_5a0,
                 (AssertionResult *)"EXPECT_CONTAIN(-2.0, bpm.GetValueList())","true","false",
                 expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_570,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x3d1,(char *)local_558._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_570,(Message *)&local_588);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548) {
        operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
      }
      if (local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_588.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_598,local_598);
      }
    }
  }
  if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    pdVar4 = (double *)
             local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 9.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    local_5a0[0] = (internal)(iVar5 == 0);
    local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_5a0[0]) {
      testing::Message::Message((Message *)&local_588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_558,(internal *)local_5a0,
                 (AssertionResult *)"EXPECT_CONTAIN(-9.0, bpm.GetValueList())","true","false",
                 expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_570,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x3d2,(char *)local_558._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_570,(Message *)&local_588);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548) {
        operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
      }
      if (local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_588.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_598,local_598);
      }
    }
  }
  if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    pdVar4 = (double *)
             local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + (uint)(ABS(*pdVar4 + 1.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != (double *)
                       local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    local_5a0[0] = (internal)(iVar5 == 0);
    local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_5a0[0]) {
      testing::Message::Message((Message *)&local_588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_558,(internal *)local_5a0,
                 (AssertionResult *)"EXPECT_CONTAIN(-1.0, bpm.GetValueList())","true","false",
                 expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_570,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x3d3,(char *)local_558._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_570,(Message *)&local_588);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_570);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548) {
        operator_delete((void *)local_558._0_8_,local_548._0_8_ + 1);
      }
      if (local_588.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_588.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      if (local_598 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_598,local_598);
      }
    }
  }
  StateTestBPMUINT((BinaryPolynomialModel<unsigned_int,_double> *)local_320);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_4e0);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_228);
  if ((double *)
      local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)(local_260 + 8));
  if (local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                    (long)local_268 -
                    (long)local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_2c0 + 0x10));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_2e8);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_320);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_80);
  return;
}

Assistant:

TEST(RemoveInteractionsFromBPM, basic) {
   
   Polynomial<uint32_t, double> polynomial {
      //linear biases
      {{1}, 1.0}, {{2}, 2.0}, {{3}, 3.0}, {{4}, 4.0},
      //quadratic biases
      {{1, 2}, 12.0}, {{1, 3}, 13.0}, {{1, 4}, 14.0},
      {{2, 3}, 23.0}, {{2, 4}, 24.0},
      {{3, 4}, 34.0},
      //To be removed
      {{11, 12, 14}, -1.0}, {{7}, -2.0}, {{2, 11}, -9.0}, {{}, -3},
      //polynomial biases
      {{1, 2, 3}, 123.0}, {{1, 2, 4}, 124.0}, {{1, 3, 4}, 134.0},
      {{2, 3, 4}, 234.0},
      {{1, 2, 3, 4}, 1234.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   PolynomialKeyList<uint32_t> removed_key_list = {
      {11, 14, 12}, {7}, {11, 2}, {}
   };
   
   bpm.RemoveInteractionsFrom(removed_key_list);
      
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}          ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({7}         ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 11}     ), 0.0);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({11, 12, 14}), 0.0);
   
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{}          ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{7}         ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{2, 11}     ), 0);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<uint32_t>{11, 12, 14}), 0);
   
   EXPECT_FALSE(EXPECT_CONTAIN(-3.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-2.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-9.0, bpm.GetValueList()));
   EXPECT_FALSE(EXPECT_CONTAIN(-1.0, bpm.GetValueList()));
   
   StateTestBPMUINT(bpm);
   
}